

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

int KYBER_parse_private_key(KYBER_private_key *out_private_key,CBS *in)

{
  int iVar1;
  uint uVar2;
  CBS s_bytes;
  CBS local_28;
  
  iVar1 = CBS_get_bytes(in,&local_28,0x480);
  uVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = vector_decode((vector *)((long)&out_private_key->opaque + 0x1840),local_28.data,0xc);
    if (iVar1 != 0) {
      iVar1 = kyber_parse_public_key_no_hash((public_key *)out_private_key,in);
      if (iVar1 != 0) {
        iVar1 = CBS_copy_bytes(in,(out_private_key->opaque).bytes + 0x620,0x20);
        uVar2 = 0;
        if (iVar1 != 0) {
          iVar1 = CBS_copy_bytes(in,(out_private_key->opaque).bytes + 0x1e40,0x20);
          if (iVar1 != 0) {
            uVar2 = (uint)(in->len == 0);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int KYBER_parse_private_key(struct KYBER_private_key *out_private_key,
                            CBS *in) {
  struct private_key *const priv = private_key_from_external(out_private_key);

  CBS s_bytes;
  if (!CBS_get_bytes(in, &s_bytes, kEncodedVectorSize) ||
      !vector_decode(&priv->s, CBS_data(&s_bytes), kLog2Prime) ||
      !kyber_parse_public_key_no_hash(&priv->pub, in) ||
      !CBS_copy_bytes(in, priv->pub.public_key_hash,
                      sizeof(priv->pub.public_key_hash)) ||
      !CBS_copy_bytes(in, priv->fo_failure_secret,
                      sizeof(priv->fo_failure_secret)) ||
      CBS_len(in) != 0) {
    return 0;
  }
  return 1;
}